

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int float128_compare_x86_64(float128 a,float128 b,float_status *status)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = a.high;
  uVar5 = a.low;
  uVar2 = b.high;
  uVar3 = b.low;
  if ((((~uVar4 & 0x7fff000000000000) != 0) ||
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
       uVar5 == 0)) &&
     (((~uVar2 & 0x7fff000000000000) != 0 ||
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
       uVar3 == 0)))) {
    if (uVar4 >> 0x3f == uVar2 >> 0x3f) {
      if (uVar4 == uVar2 && uVar5 == uVar3) {
        return 0;
      }
      uVar1 = (uint)(byte)(((uVar5 < uVar3 && uVar4 == uVar2 || uVar4 < uVar2) ^ a.high._7_1_ >> 7)
                          * '\x02');
    }
    else {
      if ((((uVar2 | uVar4) & 0x7fffffffffffffff) == 0 && uVar5 == 0) && uVar3 == 0) {
        return 0;
      }
      uVar1 = (a.high._4_4_ >> 0x1f) * -2 & 0xff;
    }
    return 1 - uVar1;
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  return 2;
}

Assistant:

int float128_compare(float128 a, float128 b, float_status *status)
{
    return float128_compare_internal(a, b, 0, status);
}